

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  byte bVar2;
  u8 uVar3;
  short sVar4;
  NameContext *pNC;
  Parse *pParse;
  sqlite3 *psVar5;
  SrcList *pSVar6;
  IdList *pIVar7;
  Upsert *pUVar8;
  ExprList *pEList;
  Db *pDVar9;
  Schema *pSVar10;
  bool bVar11;
  u8 uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  size_t sVar18;
  FuncDef *pFunc;
  Expr *pEVar19;
  RenameToken *pRVar20;
  Select *pSVar21;
  Schema **ppSVar22;
  ushort uVar23;
  ushort uVar24;
  ulong uVar25;
  char *pcVar26;
  char *pcVar27;
  char *pcVar28;
  uint uVar29;
  uint uVar30;
  Expr *pEVar31;
  SrcList_item *pSVar32;
  uint uVar33;
  long lVar34;
  char *zLeft;
  char **ppcVar35;
  Column *pCVar36;
  long lVar37;
  ulong uVar38;
  Table *pTVar39;
  NameContext *pNVar40;
  int iVar41;
  IdList_item *pIVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  Walker w;
  int local_114;
  char *local_f0;
  SrcList_item *local_d0;
  Schema *local_a8;
  Table **local_a0;
  SrcList *local_78;
  undefined8 local_70;
  anon_union_8_2_31fbcc88_for_y *local_68;
  Walker local_60;
  
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  bVar2 = pExpr->op;
  if (0x7e < bVar2) {
    if (bVar2 < 0x90) {
      if (bVar2 != 0x7f) {
        if (bVar2 == 0x82) {
          pEVar31 = pExpr->pLeft;
          notValid(pParse,pNC,"the \".\" operator",0x20);
          pEVar19 = pExpr->pRight;
          if (pEVar19->op == ';') {
            pcVar28 = (char *)0x0;
          }
          else {
            pcVar28 = (pEVar31->u).zToken;
            pEVar31 = pEVar19->pLeft;
            pEVar19 = pEVar19->pRight;
          }
          pcVar27 = (pEVar31->u).zToken;
          local_f0 = (pEVar19->u).zToken;
          if (1 < pParse->eParseMode) {
            for (pRVar20 = pParse->pRename; pRVar20 != (RenameToken *)0x0; pRVar20 = pRVar20->pNext)
            {
              if ((Expr *)pRVar20->p == pEVar19) {
                pRVar20->p = pExpr;
                break;
              }
            }
            pRVar20 = pParse->pRename;
            if (pRVar20 != (RenameToken *)0x0) {
              do {
                if ((Expr *)pRVar20->p == pEVar31) {
                  pRVar20->p = &pExpr->y;
                  break;
                }
                pRVar20 = pRVar20->pNext;
              } while (pRVar20 != (RenameToken *)0x0);
            }
          }
          goto LAB_0016da96;
        }
        goto switchD_0016d6a2_caseD_2e;
      }
      goto switchD_0016d6a2_caseD_31;
    }
    if (bVar2 == 0x90) {
      notValid(pParse,pNC,"parameters",0x26);
      goto switchD_0016d6a2_caseD_2e;
    }
    if (bVar2 == 0x9c) goto switchD_0016d6a2_caseD_2d;
    if (bVar2 != 0x9d) goto switchD_0016d6a2_caseD_2e;
    pSVar21 = (pExpr->x).pSelect;
    uVar25 = 0;
    iVar13 = 0;
    if (pSVar21 != (Select *)0x0) {
      iVar13 = *(int *)&pSVar21->pEList;
    }
    psVar5 = pParse->db;
    uVar12 = psVar5->enc;
    pcVar28 = (pExpr->u).zToken;
    if (pcVar28 != (char *)0x0) {
      sVar18 = strlen(pcVar28);
      uVar25 = (ulong)((uint)sVar18 & 0x3fffffff);
    }
    pFunc = sqlite3FindFunction(psVar5,pcVar28,iVar13,uVar12,'\0');
    if (pFunc == (FuncDef *)0x0) {
      bVar43 = false;
      pFunc = sqlite3FindFunction(pParse->db,pcVar28,-2,uVar12,'\0');
      bVar44 = pFunc == (FuncDef *)0x0;
      bVar11 = !bVar44;
    }
    else {
      bVar43 = pFunc->xFinalize != (_func_void_sqlite3_context_ptr *)0x0;
      if ((pFunc->funcFlags & 0x400) != 0) {
        pExpr->flags = pExpr->flags | 0x41000;
        if (iVar13 == 2) {
          iVar13 = exprProbability((Expr *)pSVar21->pSrc);
          pExpr->iTable = iVar13;
          if (iVar13 < 0) {
            sqlite3ErrorMsg(pParse,
                            "second argument to likelihood() must be a constant between 0.0 and 1.0"
                           );
            pNC->nErr = pNC->nErr + 1;
          }
        }
        else {
          iVar13 = 0x7800000;
          if (*pFunc->zName == 'u') {
            iVar13 = 0x800000;
          }
          pExpr->iTable = iVar13;
        }
      }
      iVar13 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFunc->zName,(char *)0x0);
      if (iVar13 != 0) {
        if (iVar13 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFunc->zName);
          pNC->nErr = pNC->nErr + 1;
        }
        pExpr->op = 'n';
        return 1;
      }
      uVar33 = pFunc->funcFlags;
      if ((uVar33 & 0x2800) != 0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 2);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar33 >> 0xb & 1) == 0) {
        notValid(pParse,pNC,"non-deterministic functions",0x22);
      }
      bVar44 = true;
      if ((pFunc->funcFlags & 0x40000) == 0) {
        bVar11 = true;
      }
      else {
        bVar45 = pParse->nested != '\0';
        bVar11 = sqlite3Config.bInternalFunctions != 0 || bVar45;
        if (sqlite3Config.bInternalFunctions == 0 && !bVar45) {
          pFunc = (FuncDef *)0x0;
        }
      }
    }
    if (1 < pParse->eParseMode) goto LAB_0016e722;
    if (((pFunc != (FuncDef *)0x0) && (pFunc->xValue == (_func_void_sqlite3_context_ptr *)0x0)) &&
       ((pExpr->flags & 0x1000000) != 0)) {
      pcVar27 = "%.*s() may not be used as a window function";
      goto LAB_0016e6dd;
    }
    if ((bVar43) &&
       (((pNC->ncFlags & 1) == 0 ||
        ((bVar43 &&
         ((((pFunc->funcFlags & 0x10000) != 0 && ((pExpr->y).pTab == (Table *)0x0)) ||
          ((bVar43 && (((pNC->ncFlags >> 0xe & 1) == 0 && ((pExpr->y).pTab != (Table *)0x0))))))))))
       )) {
      if ((pFunc->funcFlags & 0x10000) == 0) {
        pcVar27 = "window";
        if ((pExpr->y).pTab == (Table *)0x0) {
          pcVar27 = "aggregate";
        }
      }
      else {
        pcVar27 = "window";
      }
      bVar43 = false;
      sqlite3ErrorMsg(pParse,"misuse of %s function %.*s()",pcVar27,uVar25,pcVar28);
LAB_0016e6ef:
      pNC->nErr = pNC->nErr + 1;
    }
    else {
      if ((!bVar11) && ((pParse->db->init).busy == '\0')) {
        pcVar27 = "no such function: %.*s";
LAB_0016e6dd:
        sqlite3ErrorMsg(pParse,pcVar27,uVar25,pcVar28);
        goto LAB_0016e6ef;
      }
      if (!bVar44) {
        pcVar27 = "wrong number of arguments to function %.*s()";
        goto LAB_0016e6dd;
      }
    }
    if (bVar43) {
      uVar24 = 0xbfff;
      if ((pExpr->y).pTab == (Table *)0x0) {
        uVar24 = 0xfffe;
      }
      pNC->ncFlags = pNC->ncFlags & uVar24;
      bVar43 = true;
    }
    else {
      bVar43 = false;
    }
LAB_0016e722:
    sqlite3WalkExprList(pWalker,(ExprList *)pSVar21);
    if (!bVar43) {
      return 1;
    }
    if ((pExpr->y).pWin != (Window *)0x0) {
      pSVar21 = pNC->pWinSelect;
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pPartition);
      sqlite3WalkExprList(pWalker,((pExpr->y).pWin)->pOrderBy);
      pEVar31 = ((pExpr->y).pWin)->pFilter;
      if (pEVar31 != (Expr *)0x0) {
        walkExpr(pWalker,pEVar31);
      }
      sqlite3WindowUpdate(pParse,pSVar21->pWinDefn,(pExpr->y).pWin,pFunc);
      if ((pSVar21->pWin == (Window *)0x0) ||
         (iVar13 = sqlite3WindowCompare(pParse,pSVar21->pWin,(pExpr->y).pWin), iVar13 == 0)) {
        ((pExpr->y).pTab)->pCheck = (ExprList *)pSVar21->pWin;
        pSVar21->pWin = (Window *)pExpr->y;
      }
      pbVar1 = (byte *)((long)&pNC->ncFlags + 1);
      *pbVar1 = *pbVar1 | 0x40;
      return 1;
    }
    pExpr->op = 0x9f;
    pExpr->op2 = '\0';
    pNVar40 = pNC;
    while( true ) {
      local_78 = pNVar40->pSrcList;
      local_60.xExprCallback = exprSrcCount;
      local_60.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
      local_70 = 0;
      local_60.u.pNC = (NameContext *)&local_78;
      sqlite3WalkExprList(&local_60,(pExpr->x).pList);
      if ((0 < (int)local_70) || (local_70._4_4_ == 0)) break;
      pExpr->op2 = pExpr->op2 + '\x01';
      pNVar40 = pNVar40->pNext;
      if (pNVar40 == (NameContext *)0x0) {
LAB_0016e86d:
        *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 1;
        return 1;
      }
    }
    pNVar40->ncFlags = (ushort)pFunc->funcFlags & 0x1000 | pNVar40->ncFlags | 0x10;
    goto LAB_0016e86d;
  }
  switch(bVar2) {
  case 0x2d:
    goto switchD_0016d6a2_caseD_2d;
  case 0x2e:
  case 0x2f:
  case 0x32:
  case 0x33:
  case 0x3a:
    goto switchD_0016d6a2_caseD_2e;
  case 0x30:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0016d6a2_caseD_30;
  case 0x31:
    break;
  case 0x3b:
    local_f0 = (pExpr->u).zToken;
    pcVar28 = (char *)0x0;
    pcVar27 = (char *)0x0;
LAB_0016da96:
    psVar5 = pParse->db;
    pExpr->iTable = -1;
    iVar13 = 0;
    if ((pcVar28 == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
      local_a8 = (Schema *)0x0;
      pcVar28 = (char *)0x0;
    }
    else {
      iVar16 = psVar5->nDb;
      if ((long)iVar16 < 1) {
        local_a8 = (Schema *)0x0;
      }
      else {
        pDVar9 = psVar5->aDb;
        lVar34 = 0;
        do {
          iVar17 = sqlite3StrICmp(*(char **)((long)&pDVar9->zDbSName + lVar34),pcVar28);
          if (iVar17 == 0) {
            local_a8 = *(Schema **)((long)&pDVar9->pSchema + lVar34);
            goto LAB_0016dacd;
          }
          lVar34 = lVar34 + 0x20;
        } while ((long)iVar16 * 0x20 != lVar34);
        local_a8 = (Schema *)0x0;
      }
    }
LAB_0016dacd:
    local_68 = &pExpr->y;
    local_a0 = &pParse->pTriggerTab;
    uVar12 = 0x9e;
    local_d0 = (SrcList_item *)0x0;
    iVar16 = 0;
    local_114 = 0;
    pNVar40 = pNC;
    do {
      pSVar6 = pNVar40->pSrcList;
      if (pSVar6 != (SrcList *)0x0) {
        iVar17 = pSVar6->nSrc;
        if (0 < iVar17) {
          pSVar32 = pSVar6->a;
          iVar41 = 0;
          do {
            pTVar39 = pSVar32->pTab;
            pSVar21 = pSVar32->pSelect;
            if ((pSVar21 == (Select *)0x0) || ((pSVar21->selFlags & 0x800) == 0)) {
LAB_0016dc09:
              if ((pcVar28 == (char *)0x0) || (pTVar39->pSchema == local_a8)) {
                if (pcVar27 != (char *)0x0) {
                  pcVar26 = pSVar32->zAlias;
                  zLeft = pcVar26;
                  if (pcVar26 == (char *)0x0) {
                    zLeft = pTVar39->zName;
                  }
                  iVar14 = sqlite3StrICmp(zLeft,pcVar27);
                  if (iVar14 != 0) goto LAB_0016ddb9;
                  if ((pcVar26 != (char *)0x0) && (1 < pParse->eParseMode)) {
                    for (pRVar20 = pParse->pRename; pRVar20 != (RenameToken *)0x0;
                        pRVar20 = pRVar20->pNext) {
                      if ((anon_union_8_2_31fbcc88_for_y *)pRVar20->p == local_68) {
                        pRVar20->p = (void *)0x0;
                        break;
                      }
                    }
                  }
                }
                iVar14 = iVar16 + 1;
                if (iVar16 == 0) {
                  local_d0 = pSVar32;
                }
                sVar4 = pTVar39->nCol;
                iVar16 = iVar14;
                if (0 < sVar4) {
                  pCVar36 = pTVar39->aCol;
                  iVar14 = 0;
                  do {
                    iVar15 = sqlite3StrICmp(pCVar36->zName,local_f0);
                    if (iVar15 == 0) {
                      if (local_114 != 1) {
LAB_0016dd7e:
                        local_114 = local_114 + 1;
                        if (iVar14 == pTVar39->iPKey) {
                          iVar14 = 0xffff;
                        }
                        pExpr->iColumn = (ynVar)iVar14;
                        local_d0 = pSVar32;
                        break;
                      }
                      if (((pSVar32->fg).jointype & 4) == 0) {
                        pIVar7 = pSVar32->pUsing;
                        if ((pIVar7 == (IdList *)0x0) ||
                           (uVar25 = (ulong)pIVar7->nId, (long)uVar25 < 1)) goto LAB_0016dd7e;
                        pIVar42 = pIVar7->a;
                        iVar15 = sqlite3StrICmp(pIVar42->zName,local_f0);
                        if (iVar15 != 0) {
                          uVar38 = 0;
                          do {
                            pIVar42 = pIVar42 + 1;
                            if (uVar25 - 1 == uVar38) goto LAB_0016dd7e;
                            iVar15 = sqlite3StrICmp(pIVar42->zName,local_f0);
                            uVar38 = uVar38 + 1;
                          } while (iVar15 != 0);
                          if (uVar25 <= uVar38) goto LAB_0016dd7e;
                        }
                      }
                    }
                    iVar14 = iVar14 + 1;
                    pCVar36 = pCVar36 + 1;
                  } while (iVar14 != sVar4);
                }
              }
            }
            else {
              lVar34 = (long)pSVar21->pEList->nExpr;
              bVar11 = false;
              if (0 < lVar34) {
                ppcVar35 = &pSVar21->pEList->a[0].zSpan;
                lVar37 = 0;
                do {
                  iVar14 = sqlite3MatchSpanName(*ppcVar35,local_f0,pcVar27,pcVar28);
                  if (iVar14 != 0) {
                    local_114 = local_114 + 1;
                    pExpr->iColumn = (ynVar)lVar37;
                    iVar16 = 2;
                    bVar11 = true;
                    local_d0 = pSVar32;
                  }
                  lVar37 = lVar37 + 1;
                  ppcVar35 = ppcVar35 + 4;
                } while (lVar34 != lVar37);
              }
              if (pcVar27 != (char *)0x0 && !bVar11) goto LAB_0016dc09;
            }
LAB_0016ddb9:
            iVar41 = iVar41 + 1;
            pSVar32 = pSVar32 + 1;
          } while (iVar41 != iVar17);
        }
        if (local_d0 == (SrcList_item *)0x0) {
          local_d0 = (SrcList_item *)0x0;
        }
        else {
          pExpr->iTable = local_d0->iCursor;
          pTVar39 = local_d0->pTab;
          (pExpr->y).pTab = pTVar39;
          if (((local_d0->fg).jointype & 8) != 0) {
            pbVar1 = (byte *)((long)&pExpr->flags + 2);
            *pbVar1 = *pbVar1 | 0x10;
          }
          local_a8 = pTVar39->pSchema;
        }
      }
      if (iVar16 == 0 && (pcVar27 != (char *)0x0 && pcVar28 == (char *)0x0)) {
        pTVar39 = *local_a0;
        if (pTVar39 == (Table *)0x0) {
          pTVar39 = (Table *)0x0;
        }
        else {
          uVar3 = pParse->eTriggerOp;
          if (uVar3 == 'u') {
LAB_0016de95:
            iVar16 = sqlite3StrICmp("old",pcVar27);
            iVar17 = 0;
            if (iVar16 != 0) {
              pTVar39 = (Table *)0x0;
              goto LAB_0016ded5;
            }
          }
          else {
            iVar16 = sqlite3StrICmp("new",pcVar27);
            if (iVar16 != 0) {
              if (uVar3 == 't') {
                pTVar39 = (Table *)0x0;
                goto LAB_0016ded5;
              }
              goto LAB_0016de95;
            }
            iVar17 = 1;
          }
          pExpr->iTable = iVar17;
        }
LAB_0016ded5:
        if ((((pNVar40->ncFlags & 0x200) != 0) &&
            (pUVar8 = (pNVar40->uNC).pUpsert, pUVar8 != (Upsert *)0x0)) &&
           (iVar16 = sqlite3StrICmp("excluded",pcVar27), iVar16 == 0)) {
          pTVar39 = pUVar8->pUpsertSrc->a[0].pTab;
          pExpr->iTable = 2;
        }
        if (pTVar39 == (Table *)0x0) {
          iVar16 = 0;
        }
        else {
          local_a8 = pTVar39->pSchema;
          uVar33 = (uint)pTVar39->nCol;
          if (pTVar39->nCol < 1) {
            uVar30 = 0;
          }
          else {
            pCVar36 = pTVar39->aCol;
            uVar29 = 0;
            do {
              iVar16 = sqlite3StrICmp(pCVar36->zName,local_f0);
              if (iVar16 == 0) {
                uVar30 = uVar29;
                if ((int)pTVar39->iPKey == uVar29) {
                  uVar30 = 0xffffffff;
                }
                break;
              }
              uVar29 = uVar29 + 1;
              pCVar36 = pCVar36 + 1;
              uVar30 = uVar33;
            } while (uVar33 != uVar29);
          }
          if (((int)uVar33 <= (int)uVar30) && (iVar16 = sqlite3IsRowid(local_f0), iVar16 != 0)) {
            uVar30 = uVar30 | -(uint)((pTVar39->tabFlags & 0x40) == 0);
          }
          iVar16 = 1;
          if ((int)uVar30 < (int)uVar33) {
            local_114 = local_114 + 1;
            if (pExpr->iTable == 2) {
              if (pParse->eParseMode < 2) {
                pExpr->iTable = uVar30 + ((pNVar40->uNC).pUpsert)->regData;
                pbVar1 = (byte *)((long)&pExpr->flags + 2);
                *pbVar1 = *pbVar1 | 0x40;
                uVar12 = 0xa4;
              }
              else {
                pExpr->iColumn = (ynVar)uVar30;
                (pExpr->y).pTab = pTVar39;
                uVar12 = 0x9e;
              }
            }
            else {
              if ((int)uVar30 < 0) {
                pExpr->affinity = 'D';
              }
              else {
                uVar33 = 1 << ((byte)uVar30 & 0x1f);
                if (0x1f < (int)uVar30) {
                  uVar33 = 0xffffffff;
                }
                if (pExpr->iTable == 0) {
                  pParse->oldmask = pParse->oldmask | uVar33;
                }
                else {
                  pParse->newmask = pParse->newmask | uVar33;
                }
              }
              (pExpr->y).pTab = pTVar39;
              pExpr->iColumn = (ynVar)uVar30;
              uVar12 = 'M';
            }
          }
        }
      }
      if (((local_114 == 0) && (iVar16 == 1)) &&
         ((local_d0 != (SrcList_item *)0x0 &&
          (((local_114 = 0, (pNVar40->ncFlags & 0x20) == 0 &&
            (iVar17 = sqlite3IsRowid(local_f0), iVar17 != 0)) &&
           ((local_d0->pTab->tabFlags & 0x40) == 0)))))) {
        pExpr->iColumn = -1;
        pExpr->affinity = 'D';
        local_114 = 1;
      }
      if (((pcVar27 == (char *)0x0) && (local_114 == 0)) && ((pNVar40->ncFlags & 0x80) != 0)) {
        pEList = (pNVar40->uNC).pEList;
        if (pEList->nExpr < 1) {
          local_114 = 0;
        }
        else {
          lVar34 = 0;
          local_114 = 0;
          do {
            pcVar26 = pEList->a[lVar34].zName;
            bVar11 = true;
            if ((pcVar26 == (char *)0x0) || (iVar17 = sqlite3StrICmp(pcVar26,local_f0), iVar17 != 0)
               ) {
              iVar17 = 0;
            }
            else {
              pEVar31 = pEList->a[lVar34].pExpr;
              if (((pNVar40->ncFlags & 1) == 0) && ((pEVar31->flags & 2) != 0)) {
                bVar11 = false;
                sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar26);
                iVar17 = 1;
              }
              else {
                uVar3 = pEVar31->op;
                if (uVar3 == 0xa4) {
                  uVar3 = pEVar31->op2;
                }
                if (uVar3 == '\x7f') {
                  pSVar21 = (pEVar31->x).pSelect;
LAB_0016e185:
                  if (((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr != 1) {
                    bVar11 = false;
                    sqlite3ErrorMsg(pParse,"row value misused");
                    iVar17 = 1;
                    goto LAB_0016e125;
                  }
                }
                else if (uVar3 == 0xa5) {
                  pSVar21 = (Select *)&pEVar31->x;
                  goto LAB_0016e185;
                }
                resolveAlias(pParse,pEList,(int)lVar34,pExpr,"",iVar13);
                local_114 = 1;
                iVar17 = 0x16;
                if (1 < pParse->eParseMode) {
                  for (pRVar20 = pParse->pRename; pRVar20 != (RenameToken *)0x0;
                      pRVar20 = pRVar20->pNext) {
                    if ((Expr *)pRVar20->p == pExpr) {
                      pRVar20->p = (void *)0x0;
                      break;
                    }
                  }
                }
                local_d0 = (SrcList_item *)0x0;
                bVar11 = false;
              }
            }
LAB_0016e125:
            if (!bVar11) goto LAB_0016e285;
            lVar34 = lVar34 + 1;
          } while (lVar34 < pEList->nExpr);
        }
      }
      iVar17 = 5;
      if (local_114 == 0) {
        pNVar40 = pNVar40->pNext;
        iVar13 = iVar13 + 1;
        iVar17 = 0;
        local_114 = 0;
      }
LAB_0016e285:
      if (iVar17 != 0) {
        if (iVar17 != 5) {
          if (iVar17 != 0x16) {
            return 2;
          }
          goto LAB_0016e60b;
        }
        break;
      }
    } while (pNVar40 != (NameContext *)0x0);
    if ((pcVar27 == (char *)0x0) && (local_114 == 0)) {
      if ((pExpr->flags & 0x40) != 0) {
        pExpr->op = 'j';
        (pExpr->y).pTab = (Table *)0x0;
        return 1;
      }
      iVar13 = sqlite3ExprIdToTrueFalse(pExpr);
      if (iVar13 != 0) {
        return 1;
      }
    }
    if (local_114 != 1) {
      pcVar26 = "ambiguous column name";
      if (local_114 == 0) {
        pcVar26 = "no such column";
      }
      if (pcVar28 == (char *)0x0) {
        if (pcVar27 == (char *)0x0) {
          sqlite3ErrorMsg(pParse,"%s: %s",pcVar26,local_f0);
        }
        else {
          sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar26,pcVar27,local_f0);
        }
      }
      else {
        sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar26,pcVar28,pcVar27,local_f0);
      }
      pParse->checkSchema = '\x01';
      pNC->nErr = pNC->nErr + 1;
    }
    uVar24 = pExpr->iColumn;
    if ((-1 < (short)uVar24) && (local_d0 != (SrcList_item *)0x0)) {
      uVar23 = 0x3f;
      if (uVar24 < 0x3f) {
        uVar23 = uVar24;
      }
      local_d0->colUsed = local_d0->colUsed | 1L << ((byte)uVar23 & 0x3f);
    }
    if (pExpr->pLeft != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar5,pExpr->pLeft);
    }
    pExpr->pLeft = (Expr *)0x0;
    if (pExpr->pRight != (Expr *)0x0) {
      sqlite3ExprDeleteNN(psVar5,pExpr->pRight);
    }
    pExpr->pRight = (Expr *)0x0;
    pExpr->op = uVar12;
    pbVar1 = (byte *)((long)&pExpr->flags + 2);
    *pbVar1 = *pbVar1 | 0x80;
LAB_0016e60b:
    if (local_114 != 1) {
      return 2;
    }
    if (((pExpr->flags & 0x400000) == 0) && (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
      if (local_a8 == (Schema *)0x0) {
        iVar13 = -1000000;
      }
      else {
        iVar13 = -1;
        ppSVar22 = &pParse->db->aDb->pSchema;
        do {
          iVar13 = iVar13 + 1;
          pSVar10 = *ppSVar22;
          ppSVar22 = ppSVar22 + 4;
        } while (pSVar10 != local_a8);
      }
      if (-1 < iVar13) {
        if (pExpr->op == 'M') {
LAB_0016e884:
          pTVar39 = *local_a0;
        }
        else {
          lVar34 = (long)pNVar40->pSrcList->nSrc;
          if (lVar34 < 1) {
            pTVar39 = (Table *)0x0;
          }
          else {
            local_a0 = &pNVar40->pSrcList->a[0].pTab;
            pTVar39 = (Table *)0x0;
            do {
              if (pExpr->iTable == *(int *)(local_a0 + 4)) goto LAB_0016e884;
              local_a0 = local_a0 + 0xe;
              lVar34 = lVar34 + -1;
            } while (lVar34 != 0);
          }
        }
        if (pTVar39 != (Table *)0x0) {
          lVar34 = (long)pExpr->iColumn;
          if ((pExpr->iColumn < 0) && (lVar34 = (long)pTVar39->iPKey, lVar34 < 0)) {
            pcVar28 = "ROWID";
          }
          else {
            pcVar28 = pTVar39->aCol[lVar34].zName;
          }
          iVar13 = sqlite3AuthReadCol(pParse,pTVar39->zName,pcVar28,iVar13);
          if (iVar13 == 2) {
            pExpr->op = 'n';
          }
        }
      }
    }
    pNC->nRef = pNC->nRef + 1;
    while (pNVar40 != pNC) {
      pNC = pNC->pNext;
      pNC->nRef = pNC->nRef + 1;
    }
    return 1;
  default:
    if (bVar2 != 0x14) goto switchD_0016d6a2_caseD_2e;
  }
switchD_0016d6a2_caseD_31:
  if ((pExpr->flags & 0x800) != 0) {
    iVar13 = pNC->nRef;
    notValid(pParse,pNC,"subqueries",0x26);
    sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
    if (iVar13 != pNC->nRef) {
      *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
      *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 0x40;
    }
  }
  goto switchD_0016d6a2_caseD_2e;
switchD_0016d6a2_caseD_2d:
  pEVar31 = pExpr->pRight;
  bVar11 = true;
  if (pEVar31->op == ';') {
    iVar13 = resolveExprStep(pWalker,pEVar31);
    if (iVar13 == 2) {
      pEVar31 = (Expr *)0x2;
      bVar11 = false;
    }
    else if (pEVar31->op == 0x9b) {
      pExpr->op2 = pExpr->op;
      pExpr->op = 0xa3;
      bVar11 = false;
      pEVar31 = (Expr *)0x0;
    }
  }
  if (!bVar11) {
    return (int)pEVar31;
  }
switchD_0016d6a2_caseD_30:
  if (pParse->db->mallocFailed != '\0') goto switchD_0016d6a2_caseD_2e;
  pEVar31 = pExpr->pLeft;
  uVar12 = pEVar31->op;
  if (uVar12 == 0xa4) {
    uVar12 = pEVar31->op2;
  }
  if (uVar12 == '\x7f') {
    pSVar21 = (pEVar31->x).pSelect;
LAB_0016d8de:
    iVar13 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr;
  }
  else {
    iVar13 = 1;
    if (uVar12 == 0xa5) {
      pSVar21 = (Select *)&pEVar31->x;
      goto LAB_0016d8de;
    }
  }
  if (pExpr->op == '0') {
    pEVar31 = ((pExpr->x).pList)->a[0].pExpr;
    uVar12 = pEVar31->op;
    if (uVar12 == 0xa4) {
      uVar12 = pEVar31->op2;
    }
    if (uVar12 == '\x7f') {
      pSVar21 = (pEVar31->x).pSelect;
LAB_0016d956:
      iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr;
    }
    else {
      iVar16 = 1;
      if (uVar12 == 0xa5) {
        pSVar21 = (Select *)&pEVar31->x;
        goto LAB_0016d956;
      }
    }
    if (iVar16 == iVar13) {
      pEVar31 = *(Expr **)((pExpr->x).pList + 1);
      goto LAB_0016d966;
    }
  }
  else {
    pEVar31 = pExpr->pRight;
LAB_0016d966:
    uVar12 = pEVar31->op;
    if (uVar12 == 0xa4) {
      uVar12 = pEVar31->op2;
    }
    if (uVar12 == '\x7f') {
      pSVar21 = (pEVar31->x).pSelect;
    }
    else {
      iVar16 = 1;
      if (uVar12 != 0xa5) goto LAB_0016d99a;
      pSVar21 = (Select *)&pEVar31->x;
    }
    iVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar21->pEList)->pList->nExpr;
  }
LAB_0016d99a:
  if (iVar13 != iVar16) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
switchD_0016d6a2_caseD_2e:
  iVar13 = 2;
  if (pParse->nErr == 0) {
    iVar13 = (uint)(pParse->db->mallocFailed != '\0') * 2;
  }
  return iVar13;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a;
      assert( HasRowid(pItem->pTab) && pItem->pTab->pSelect==0 );
      pExpr->op = TK_COLUMN;
      pExpr->y.pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        Expr *pLeft = pExpr->pLeft;
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pLeft->u.zToken;
          pLeft = pRight->pLeft;
          pRight = pRight->pRight;
        }
        zTable = pLeft->u.zToken;
        zColumn = pRight->u.zToken;
        if( IN_RENAME_OBJECT ){
          sqlite3RenameTokenRemap(pParse, (void*)pExpr, (void*)pRight);
          sqlite3RenameTokenRemap(pParse, (void*)&pExpr->y.pTab, (void*)pLeft);
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_INTERNAL)!=0
         && pParse->nested==0
         && sqlite3Config.bInternalFunctions==0
        ){
          /* Internal-use-only functions are disallowed unless the
          ** SQL is being compiled using sqlite3NestedParse() */
          no_such_func = 1;
          pDef = 0;
        }
      }

      if( 0==IN_RENAME_OBJECT ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        assert( is_agg==0 || (pDef->funcFlags & SQLITE_FUNC_MINMAX)
          || (pDef->xValue==0 && pDef->xInverse==0)
          || (pDef->xValue && pDef->xInverse && pDef->xSFunc && pDef->xFinalize)
        );
        if( pDef && pDef->xValue==0 && ExprHasProperty(pExpr, EP_WinFunc) ){
          sqlite3ErrorMsg(pParse, 
              "%.*s() may not be used as a window function", nId, zId
          );
          pNC->nErr++;
        }else if( 
              (is_agg && (pNC->ncFlags & NC_AllowAgg)==0)
           || (is_agg && (pDef->funcFlags&SQLITE_FUNC_WINDOW) && !pExpr->y.pWin)
           || (is_agg && pExpr->y.pWin && (pNC->ncFlags & NC_AllowWin)==0)
        ){
          const char *zType;
          if( (pDef->funcFlags & SQLITE_FUNC_WINDOW) || pExpr->y.pWin ){
            zType = "window";
          }else{
            zType = "aggregate";
          }
          sqlite3ErrorMsg(pParse, "misuse of %s function %.*s()",zType,nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#else
        if( (is_agg && (pNC->ncFlags & NC_AllowAgg)==0) ){
          sqlite3ErrorMsg(pParse,"misuse of aggregate function %.*s()",nId,zId);
          pNC->nErr++;
          is_agg = 0;
        }
#endif
        else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                  && pParse->explain==0
#endif
        ){
          sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
          pNC->nErr++;
        }else if( wrong_num_args ){
          sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
               nId, zId);
          pNC->nErr++;
        }
        if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
          pNC->ncFlags &= ~(pExpr->y.pWin ? NC_AllowWin : NC_AllowAgg);
#else
          pNC->ncFlags &= ~NC_AllowAgg;
#endif
        }
      }
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( pExpr->y.pWin ){
          Select *pSel = pNC->pWinSelect;
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pPartition);
          sqlite3WalkExprList(pWalker, pExpr->y.pWin->pOrderBy);
          sqlite3WalkExpr(pWalker, pExpr->y.pWin->pFilter);
          sqlite3WindowUpdate(pParse, pSel->pWinDefn, pExpr->y.pWin, pDef);
          if( 0==pSel->pWin 
           || 0==sqlite3WindowCompare(pParse, pSel->pWin, pExpr->y.pWin) 
          ){
            pExpr->y.pWin->pNextWin = pSel->pWin;
            pSel->pWin = pExpr->y.pWin;
          }
          pNC->ncFlags |= NC_AllowWin;
        }else
#endif /* SQLITE_OMIT_WINDOWFUNC */
        {
          NameContext *pNC2 = pNC;
          pExpr->op = TK_AGG_FUNCTION;
          pExpr->op2 = 0;
          while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
            pExpr->op2++;
            pNC2 = pNC2->pNext;
          }
          assert( pDef!=0 );
          if( pNC2 ){
            assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
            testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
            pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

          }
          pNC->ncFlags |= NC_AllowAgg;
        }
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_IS:
    case TK_ISNOT: {
      Expr *pRight;
      assert( !ExprHasProperty(pExpr, EP_Reduced) );
      /* Handle special cases of "x IS TRUE", "x IS FALSE", "x IS NOT TRUE",
      ** and "x IS NOT FALSE". */
      if( (pRight = pExpr->pRight)->op==TK_ID ){
        int rc = resolveExprStep(pWalker, pRight);
        if( rc==WRC_Abort ) return WRC_Abort;
        if( pRight->op==TK_TRUEFALSE ){
          pExpr->op2 = pExpr->op;
          pExpr->op = TK_TRUTH;
          return WRC_Continue;
        }
      }
      /* Fall thru */
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}